

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O3

int pt_qry_sync_backward(pt_query_decoder *decoder,uint64_t *ip)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  pt_config *config;
  
  if (decoder == (pt_query_decoder *)0x0) {
    iVar2 = -2;
  }
  else {
    puVar3 = (decoder->evdec).pacdec.pos;
    if ((puVar3 == (uint8_t *)0x0) &&
       (puVar3 = (decoder->evdec).pacdec.config.end, puVar3 == (uint8_t *)0x0)) {
      iVar2 = -10;
    }
    else {
      puVar4 = puVar3;
      do {
        while( true ) {
          decoder->status = -3;
          pt_tnt_cache_init(&decoder->tnt);
          pt_time_init(&decoder->last_time);
          do {
            iVar2 = pt_evt_sync_backward(&decoder->evdec);
            if (iVar2 < 0) {
              return iVar2;
            }
            puVar1 = (decoder->evdec).pacdec.pos;
          } while (puVar4 <= puVar1);
          iVar2 = pt_qry_start(decoder,ip);
          puVar4 = puVar1;
          if (iVar2 < 0) break;
          if ((decoder->evdec).pacdec.pos < puVar3) {
            return 0;
          }
        }
      } while (iVar2 == -7);
    }
  }
  return iVar2;
}

Assistant:

int pt_qry_sync_backward(struct pt_query_decoder *decoder, uint64_t *ip)
{
	const uint8_t *start, *sync, *pos;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	start = pt_qry_pos(decoder);
	if (!start) {
		const struct pt_config *config;

		config = pt_qry_config(decoder);
		if (!config)
			return -pte_internal;

		start = config->end;
		if (!start)
			return -pte_bad_config;
	}

	sync = start;
	for (;;) {
		errcode = pt_qry_reset(decoder);
		if (errcode < 0)
			return errcode;

		do {
			errcode = pt_evt_sync_backward(&decoder->evdec);
			if (errcode < 0)
				return errcode;

			pos = pt_qry_pos(decoder);
		} while (sync <= pos);

		sync = pos;

		errcode = pt_qry_start(decoder, ip);
		if (errcode < 0) {
			/* Ignore incomplete trace segments at the end.  We
			 * need a full PSB+ to start decoding.
			 */
			if (errcode != -pte_eos)
				return errcode;

			continue;
		}

		/* When starting inside or right after PSB+, we may end up at
		 * the same PSB again.  Skip it.
		 */
		pos = pt_qry_pos(decoder);
		if (pos < start)
			break;
	}

	return 0;
}